

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O2

TiXmlString operator+(TiXmlString *a,char *b)

{
  size_t len;
  char *in_RDX;
  
  a->rep_ = &TiXmlString::nullrep_;
  len = strlen(in_RDX);
  TiXmlString::reserve(a,**(long **)b + len);
  TiXmlString::operator+=(a,(TiXmlString *)b);
  TiXmlString::append(a,in_RDX,len);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const TiXmlString & a, const char* b)
{
	TiXmlString tmp;
	TiXmlString::size_type b_len = static_cast<TiXmlString::size_type>( strlen(b) );
	tmp.reserve(a.length() + b_len);
	tmp += a;
	tmp.append(b, b_len);
	return tmp;
}